

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

bool QMetaType::canConvert(QMetaType fromType,QMetaType toType)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
  *pQVar7;
  Type *this;
  function<bool_(const_void_*,_void_*)> *pfVar8;
  pair<int,_int> k;
  InterfaceType *toType_00;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
  *this_00;
  QMetaType fromType_00;
  long in_FS_OFFSET;
  QMetaType in_stack_ffffffffffffffa8;
  InterfaceType *in_stack_ffffffffffffffb0;
  QMetaType local_48;
  QMetaType toType_local;
  QMetaType fromType_local;
  QMetaType local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  toType_local = toType;
  fromType_local = fromType;
  uVar3 = registerHelper(&fromType_local);
  uVar4 = registerHelper(&toType_local);
  if (uVar4 == 0 || uVar3 == 0) {
    bVar1 = false;
    goto LAB_0026faee;
  }
  bVar1 = true;
  if (uVar3 == uVar4) goto LAB_0026faee;
  uVar6 = uVar4;
  if ((int)uVar4 < (int)uVar3) {
    uVar6 = uVar3;
  }
  this_00 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
             *)(ulong)uVar6;
  pQVar7 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
            *)qModuleHelperForType(uVar6);
  if ((pQVar7 != (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
                  *)0x0) &&
     (iVar5 = (*(*(_func_int ***)pQVar7)[1])(pQVar7,0,(ulong)uVar3,0,(ulong)uVar4), this_00 = pQVar7
     , (char)iVar5 != '\0')) goto LAB_0026faee;
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypesConversionRegistry>_>
         ::operator()(this_00);
  k.second = uVar4;
  k.first = uVar3;
  pfVar8 = QMetaTypeFunctionRegistry<std::function<bool_(const_void_*,_void_*)>,_std::pair<int,_int>_>
           ::function(this,k);
  if (pfVar8 != (function<bool_(const_void_*,_void_*)> *)0x0) goto LAB_0026faee;
  uVar6 = qMetaTypeId<QSequentialIterable>();
  if (uVar4 == uVar6) {
    local_30.d_ptr = fromType_local.d_ptr;
    iVar5 = registerHelper(&local_30);
    if ((iVar5 - 9U < 0x29) &&
       (bVar1 = true, (0x1000000000fU >> ((ulong)(iVar5 - 9U) & 0x3f) & 1) != 0)) goto LAB_0026faee;
    in_stack_ffffffffffffffb0 =
         &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaSequence>_>::metaType;
    fromType_00.d_ptr = local_30.d_ptr;
  }
  else {
    uVar6 = qMetaTypeId<QAssociativeIterable>();
    if (uVar4 == uVar6) {
      local_30.d_ptr = fromType_local.d_ptr;
      iVar5 = registerHelper(&local_30);
      bVar1 = true;
      if ((iVar5 == 8) || (iVar5 == 0x1c)) goto LAB_0026faee;
      in_stack_ffffffffffffffb0 =
           &QtPrivate::QMetaTypeInterfaceWrapper<QIterable<QMetaAssociation>_>::metaType;
      fromType_00.d_ptr = local_30.d_ptr;
    }
    else {
      if (uVar4 == 8) {
LAB_0026fb6b:
        toType_00 = &QtPrivate::QMetaTypeInterfaceWrapper<QAssociativeIterable>::metaType;
LAB_0026fb77:
        bVar2 = canConvert(fromType_local,(QMetaType)toType_00);
LAB_0026fb8f:
        if (bVar2 != false) goto LAB_0026faee;
      }
      else {
        if (uVar4 == 0x3a) {
          bVar2 = hasRegisteredConverterFunction
                            ((QMetaType)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
          goto LAB_0026fb8f;
        }
        if (uVar4 == 0x1c) goto LAB_0026fb6b;
        if (uVar4 == 9) {
          toType_00 = &QtPrivate::QMetaTypeInterfaceWrapper<QSequentialIterable>::metaType;
          goto LAB_0026fb77;
        }
      }
      fromType_00.d_ptr = fromType_local.d_ptr;
      if ((fromType_local.d_ptr == (QMetaTypeInterface *)0x0) ||
         (((fromType_local.d_ptr)->flags & 0x10) == 0)) {
        if ((toType_local.d_ptr == (QMetaTypeInterface *)0x0) ||
           (((toType_local.d_ptr)->flags & 0x10) == 0)) {
          if ((uVar4 != 0x33 || fromType_local.d_ptr == (QMetaTypeInterface *)0x0) ||
             (((fromType_local.d_ptr)->flags & 0x800) == 0)) {
            bVar1 = canConvertMetaObject(fromType_local,toType_local);
          }
          goto LAB_0026faee;
        }
        if ((uVar3 == 10) || (uVar3 == 0xc)) goto LAB_0026faee;
        QMetaType((QMetaType *)&stack0xffffffffffffffb0,4);
      }
      else {
        if ((uVar4 == 10) || (uVar4 == 0xc)) goto LAB_0026faee;
        QMetaType(&local_48,4);
        in_stack_ffffffffffffffb0 = (InterfaceType *)toType_local;
        fromType_00.d_ptr = local_48.d_ptr;
      }
    }
  }
  bVar1 = canConvert(fromType_00,(QMetaType)in_stack_ffffffffffffffb0);
LAB_0026faee:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QMetaType::canConvert(QMetaType fromType, QMetaType toType)
{
    int fromTypeId = fromType.id();
    int toTypeId = toType.id();

    if (fromTypeId == UnknownType || toTypeId == UnknownType)
        return false;

    if (fromTypeId == toTypeId)
        return true;

    if (auto moduleHelper = qModuleHelperForType(qMax(fromTypeId, toTypeId))) {
        if (moduleHelper->convert(nullptr, fromTypeId, nullptr, toTypeId))
            return true;
    }
    const ConverterFunction * const f =
        customTypesConversionRegistry()->function(std::make_pair(fromTypeId, toTypeId));
    if (f)
        return true;

    if (toTypeId == qMetaTypeId<QSequentialIterable>())
        return canConvertToSequentialIterable(fromType);

    if (toTypeId == qMetaTypeId<QAssociativeIterable>())
        return canConvertToAssociativeIterable(fromType);
    if (toTypeId == QVariantList
            && canConvert(fromType, QMetaType::fromType<QSequentialIterable>())) {
        return true;
    }

    if ((toTypeId == QVariantHash || toTypeId == QVariantMap)
            && canConvert(fromType, QMetaType::fromType<QAssociativeIterable>())) {
        return true;
    }

    if (toTypeId == QVariantPair && hasRegisteredConverterFunction(
                    fromType, QMetaType::fromType<QtMetaTypePrivate::QPairVariantInterfaceImpl>()))
        return true;

    if (fromType.flags() & IsEnumeration) {
        if (toTypeId == QString || toTypeId == QByteArray)
            return true;
        return canConvert(QMetaType(LongLong), toType);
    }
    if (toType.flags() & IsEnumeration) {
        if (fromTypeId == QString || fromTypeId == QByteArray)
            return true;
        return canConvert(fromType, QMetaType(LongLong));
    }
    if (toTypeId == Nullptr && fromType.flags() & IsPointer)
        return true;
    if (canConvertMetaObject(fromType, toType))
        return true;

    return false;
}